

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O0

void __thiscall
QNetworkHeadersPrivate::parseAndSetHeader
          (QNetworkHeadersPrivate *this,KnownHeaders key,QByteArrayView value)

{
  bool bVar1;
  QHash<QNetworkRequest::KnownHeaders,_QVariant> *this_00;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  undefined1 in_stack_000000f0 [16];
  KnownHeaders *in_stack_ffffffffffffff78;
  KnownHeaders *in_stack_ffffffffffffff80;
  uint7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff98 [16];
  KnownHeaders header;
  int local_3c;
  QByteArrayView local_38;
  QVariant local_28;
  long local_8;
  
  header = in_stack_ffffffffffffff98._12_4_;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = in_ESI;
  bVar1 = QByteArrayView::isNull(&local_38);
  if (bVar1) {
    QHash<QNetworkRequest::KnownHeaders,_QVariant>::remove
              ((QHash<QNetworkRequest::KnownHeaders,_QVariant> *)(in_RDI + 0x28),(char *)&local_3c);
  }
  else {
    bVar1 = false;
    if (local_3c == 1) {
      bVar1 = QHash<QNetworkRequest::KnownHeaders,_QVariant>::contains
                        ((QHash<QNetworkRequest::KnownHeaders,_QVariant> *)
                         (ulong)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    }
    if (bVar1 == false) {
      this_00 = (QHash<QNetworkRequest::KnownHeaders,_QVariant> *)(in_RDI + 0x28);
      parseHeaderValue(header,(QByteArrayView)in_stack_000000f0);
      QHash<QNetworkRequest::KnownHeaders,_QVariant>::insert
                (this_00,in_stack_ffffffffffffff78,(QVariant *)0x1f4407);
      QVariant::~QVariant(&local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkHeadersPrivate::parseAndSetHeader(QNetworkRequest::KnownHeaders key,
                                               QByteArrayView value)
{
    if (value.isNull()) {
        cookedHeaders.remove(key);
    } else if (key == QNetworkRequest::ContentLengthHeader
               && cookedHeaders.contains(QNetworkRequest::ContentLengthHeader)) {
        // Only set the cooked header "Content-Length" once.
        // See bug QTBUG-15311
    } else {
        cookedHeaders.insert(key, parseHeaderValue(key, value));
    }
}